

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall amrex::FabArrayBase::PolarB::define(PolarB *this,FabArrayBase *fa)

{
  pointer *ppCVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *this_00;
  iterator iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  mapped_type *this_01;
  vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>> *this_02;
  _Rb_tree_node_base *p_Var13;
  int n_1;
  Box *box;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  int n;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  PolarFn convert;
  int dst_owner;
  PolarFn2 convert_corner;
  Box src_box;
  Box dst_box;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bxsnd;
  Box gbx;
  CopyComTag cct;
  Array<Box,_8> domain_src;
  PolarFn local_338;
  ulong local_330;
  Box *local_328;
  uint local_320;
  int local_31c;
  BoxArray *local_318;
  PolarFn2 local_310;
  Box local_308;
  Box local_2e8;
  ulong local_2c8;
  ulong local_2c0;
  FabArrayBase *local_2b8;
  int local_2ac;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_2a8;
  Box local_290;
  Box local_274;
  CopyComTag local_258;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  uint local_1fc;
  ulong local_1f8;
  uint local_1f0 [5];
  ulong local_1dc;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  ulong local_1c0;
  uint local_1b8;
  int local_1b4;
  uint local_1b0;
  uint local_1ac;
  int local_1a8;
  ulong local_1a4;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  ulong local_188;
  Box local_180;
  Box local_164;
  Box local_148;
  Box local_12c;
  undefined8 local_110;
  uint local_108;
  undefined8 local_104;
  uint local_fc [2];
  ulong local_f4;
  uint local_ec;
  undefined8 local_e8;
  uint local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  uint local_d0;
  undefined8 local_cc;
  uint local_c4;
  undefined4 local_c0;
  ulong local_bc;
  uint local_b4;
  undefined8 local_b0;
  uint local_a8;
  undefined4 local_a4;
  Box local_a0;
  Box BStack_84;
  Box BStack_68;
  Box BStack_4c;
  
  local_2ac = *(int *)(ParallelContext::frames + 0xc);
  local_2a8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_320 = (this->m_domain).bigend.vect[1];
  local_1f0[1] = (this->m_domain).smallend.vect[1];
  local_164.bigend.vect[1] = local_320 - local_1f0[1];
  local_338.Ly = local_164.bigend.vect[1] + 1;
  local_1d0 = (local_164.bigend.vect[1] - (local_338.Ly >> 0x1f)) + 1 >> 1;
  local_208 = (ulong)local_1d0;
  uVar19 = (this->m_domain).smallend.vect[0];
  local_210 = (ulong)uVar19;
  uVar21 = (this->m_ngrow).vect[0];
  local_2c8 = (ulong)uVar21;
  local_1f0[0] = uVar19 - uVar21;
  uVar14 = (this->m_domain).btype.itype;
  local_180.smallend.vect[2] = (this->m_ngrow).vect[2];
  local_1f0[2] = (this->m_domain).smallend.vect[2] - local_180.smallend.vect[2];
  local_180.bigend.vect[2] = (this->m_domain).bigend.vect[2] + local_180.smallend.vect[2];
  local_1dc = CONCAT44(uVar14,local_180.bigend.vect[2]) & 0xfffffffeffffffff;
  uVar23 = (this->m_ngrow).vect[1];
  local_218 = (ulong)uVar23;
  iVar4 = (this->m_domain).bigend.vect[0];
  local_318 = (BoxArray *)CONCAT44(local_318._4_4_,local_1f0[0]);
  local_2c0 = CONCAT44(local_2c0._4_4_,local_1f0[1]);
  local_1f0[3] = uVar19 - 1;
  local_1f0[4] = local_1d0 - 1;
  local_1b8 = (iVar4 - (uVar14 & 1)) + 1;
  local_1ac = (uVar21 - 1) + local_1b8;
  local_180.smallend.vect[0] = -uVar21;
  local_164.bigend.vect[1] = uVar23 + local_164.bigend.vect[1];
  local_180.smallend.vect[1] = -uVar23;
  local_180.smallend.vect[2] = -local_180.smallend.vect[2];
  local_180.bigend.vect[0] = -1;
  local_180.bigend.vect[1] = -1;
  local_180.btype.itype = 0;
  local_164.bigend.vect[0] = -1;
  local_164.btype.itype = 0;
  local_338.Lx = (iVar4 + 1) - uVar19;
  local_148.bigend.vect[1] = -1;
  local_148.btype.itype = 0;
  local_148.bigend.vect[0] = uVar21 + local_338.Lx + -1;
  local_12c.btype.itype = 0;
  local_330 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  uVar14 = -local_1d0;
  iVar20 = local_338.Lx / 2;
  iVar4 = local_338.Lx * 2;
  iVar15 = 0;
  if (iVar20 < (int)uVar19) {
    iVar15 = iVar4;
  }
  uVar23 = uVar14;
  if ((int)local_1f0[1] < (int)local_1d0) {
    uVar23 = local_1d0;
  }
  local_110 = CONCAT44(uVar23 + local_1f0[1],iVar15 - uVar19);
  iVar15 = iVar4;
  if ((int)local_1f0[0] < iVar20) {
    iVar15 = 0;
  }
  iVar15 = iVar15 + (local_1f0[0] ^ 0xffffffff);
  iVar17 = local_1d0 * 2 + -1;
  iVar24 = iVar4;
  if ((int)local_1f0[3] < iVar20) {
    iVar24 = 0;
  }
  local_f4 = (ulong)(iVar24 + (local_1f0[3] ^ 0xffffffff));
  uVar19 = uVar14;
  if ((int)local_320 < (int)local_1d0) {
    uVar19 = local_1d0;
  }
  local_e8 = CONCAT44(uVar19 + local_320,iVar15);
  iVar24 = 0;
  if (iVar20 < (int)(local_1b8 + uVar21)) {
    iVar24 = iVar4;
  }
  local_d8 = CONCAT44(uVar23 + local_1f0[1],iVar24 - (local_1b8 + uVar21));
  iVar24 = iVar4;
  if ((int)local_1b8 < iVar20) {
    iVar24 = 0;
  }
  iVar24 = iVar24 + (local_1b8 ^ 0xffffffff);
  local_104 = CONCAT44(iVar17,iVar15);
  local_cc = CONCAT44(iVar17,iVar24);
  local_fc[0] = (uint)local_1dc;
  local_fc[1] = 0;
  local_e0 = (uint)local_1dc;
  local_dc = 0;
  local_c4 = (uint)local_1dc;
  if ((int)local_1ac < iVar20) {
    iVar4 = 0;
  }
  local_bc = (ulong)(iVar4 + (local_1ac ^ 0xffffffff));
  if ((int)local_320 < (int)local_1d0) {
    uVar14 = local_1d0;
  }
  local_b0 = CONCAT44(uVar14 + local_320,iVar24);
  local_328 = &local_164;
  local_c0 = 0;
  local_a8 = (uint)local_1dc;
  local_a4 = 0;
  local_310.Lx = local_338.Lx;
  local_310.Ly = local_338.Ly;
  local_2b8 = fa;
  local_1d4 = local_1f0[0];
  local_1cc = local_1f0[2];
  local_1c8 = local_1f0[3];
  local_1c4 = local_320;
  local_1c0 = local_1dc;
  local_1b4 = local_1f0[1];
  local_1b0 = local_1f0[2];
  local_1a8 = local_1f0[4];
  local_1a4 = local_1dc;
  local_19c = local_1b8;
  local_198 = local_1d0;
  local_194 = local_1f0[2];
  local_190 = local_1ac;
  local_18c = local_320;
  local_188 = local_1dc;
  local_164.smallend.vect[0] = local_180.smallend.vect[0];
  local_164.smallend.vect[1] = local_338.Ly;
  local_164.smallend.vect[2] = local_180.smallend.vect[2];
  local_164.bigend.vect[2] = local_180.bigend.vect[2];
  local_148.smallend.vect[0] = local_338.Lx;
  local_148.smallend.vect[1] = local_180.smallend.vect[1];
  local_148.smallend.vect[2] = local_180.smallend.vect[2];
  local_148.bigend.vect[2] = local_180.bigend.vect[2];
  local_12c.smallend.vect[0] = local_338.Lx;
  local_12c.smallend.vect[1] = local_338.Ly;
  local_12c.smallend.vect[2] = local_180.smallend.vect[2];
  local_12c.bigend.vect[0] = local_148.bigend.vect[0];
  local_12c.bigend.vect[1] = local_164.bigend.vect[1];
  local_12c.bigend.vect[2] = local_180.bigend.vect[2];
  local_108 = local_1f0[2];
  local_ec = local_1f0[2];
  local_d0 = local_1f0[2];
  local_b4 = local_1f0[2];
  NonLocalBC::PolarFn2::operator()(&local_a0,&local_310,&local_180);
  NonLocalBC::PolarFn2::operator()(&BStack_84,&local_310,local_328);
  NonLocalBC::PolarFn2::operator()(&BStack_68,&local_310,&local_148);
  NonLocalBC::PolarFn2::operator()(&BStack_4c,&local_310,&local_12c);
  if (0 < (int)(uint)local_330) {
    local_318 = &local_2b8->boxarray;
    local_328 = (Box *)&this->m_ngrow;
    this_00 = (this->super_CommMetaData).m_SndTags._M_t.
              super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              .
              super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
              ._M_head_impl;
    local_2c8 = (ulong)((uint)local_330 & 0x7fffffff);
    uVar25 = 0;
    do {
      iVar4 = (local_2b8->indexArray).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar25];
      local_2c0 = uVar25;
      BATransformer::operator()
                (&local_274,&local_318->m_bat,
                 (Box *)((long)iVar4 * 0x1c +
                        *(long *)&(((local_2b8->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      if (local_274.smallend.vect[2] == (this->m_domain).smallend.vect[2]) {
        local_274.smallend.vect[2] = local_274.smallend.vect[2] - (this->m_ngrow).vect[2];
      }
      if (local_274.bigend.vect[2] == (this->m_domain).bigend.vect[2]) {
        local_274.bigend.vect[2] = local_274.bigend.vect[2] + (this->m_ngrow).vect[2];
      }
      uVar25 = 0;
      do {
        local_308.smallend.vect[0] = *(uint *)((long)&local_110 + uVar25 * 0x1c);
        local_308.smallend.vect[1] = *(uint *)((long)&local_110 + uVar25 * 0x1c + 4);
        if (local_308.smallend.vect[0] < local_274.smallend.vect[0]) {
          local_308.smallend.vect[0] = local_274.smallend.vect[0];
        }
        if (local_308.smallend.vect[1] < local_274.smallend.vect[1]) {
          local_308.smallend.vect[1] = local_274.smallend.vect[1];
        }
        local_308.smallend.vect[2] = (&local_108)[uVar25 * 7];
        if ((int)(&local_108)[uVar25 * 7] < local_274.smallend.vect[2]) {
          local_308.smallend.vect[2] = local_274.smallend.vect[2];
        }
        local_308.bigend.vect[0] = local_fc[uVar25 * 7 + -2];
        if (local_274.bigend.vect[0] < (int)local_fc[uVar25 * 7 + -2]) {
          local_308.bigend.vect[0] = local_274.bigend.vect[0];
        }
        local_308.bigend.vect[1] = local_fc[uVar25 * 7 + -1];
        if (local_274.bigend.vect[1] < (int)local_fc[uVar25 * 7 + -1]) {
          local_308.bigend.vect[1] = local_274.bigend.vect[1];
        }
        local_308.bigend.vect[2] = local_fc[uVar25 * 7];
        if (local_274.bigend.vect[2] < (int)local_fc[uVar25 * 7]) {
          local_308.bigend.vect[2] = local_274.bigend.vect[2];
        }
        local_308.btype.itype = local_274.btype.itype;
        if ((((local_308.smallend.vect[0] <= local_308.bigend.vect[0]) &&
             (local_308.smallend.vect[1] <= local_308.bigend.vect[1])) &&
            (local_308.smallend.vect[2] <= local_308.bigend.vect[2])) && (local_274.btype.itype < 8)
           ) {
          if (uVar25 < 4) {
            iVar15 = local_338.Lx * 2;
            iVar20 = iVar15;
            if (local_308.bigend.vect[0] < local_338.Lx / 2) {
              iVar20 = 0;
            }
            local_2e8.smallend.vect[0] = iVar20 + ~local_308.bigend.vect[0];
            iVar24 = local_338.Ly / 2;
            iVar20 = -iVar24;
            if (local_308.smallend.vect[1] < iVar24) {
              iVar20 = iVar24;
            }
            local_2e8.smallend.vect[1] = iVar20 + local_308.smallend.vect[1];
            if (local_308.smallend.vect[0] < local_338.Lx / 2) {
              iVar15 = 0;
            }
            local_2e8.bigend.vect[0] = iVar15 + ~local_308.smallend.vect[0];
            local_2e8.bigend.vect[1] = -iVar24;
            if (local_308.bigend.vect[1] < iVar24) {
              local_2e8.bigend.vect[1] = iVar24;
            }
            local_2e8.bigend.vect[1] = local_2e8.bigend.vect[1] + local_308.bigend.vect[1];
            local_2e8.btype.itype = 0;
            local_2e8.bigend.vect[2] = local_308.bigend.vect[2];
            local_2e8.smallend.vect[2] = local_308.smallend.vect[2];
          }
          else {
            NonLocalBC::PolarFn2::operator()(&local_2e8,&local_310,&local_308);
          }
          BoxArray::intersections(local_318,&local_2e8,&local_2a8,false,&local_328->smallend);
          uVar19 = (uint)((ulong)((long)local_2a8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2a8.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          if (0 < (int)uVar19) {
            uVar22 = (ulong)(uVar19 & 0x7fffffff);
            lVar18 = 4;
            do {
              iVar15 = *(int *)((long)((local_2a8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).smallend
                                      .vect + lVar18 + -8);
              local_31c = *(int *)(*(long *)&(((local_2b8->distributionMap).m_ref.
                                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_pmap).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)iVar15 * 4);
              if (local_31c != local_2ac) {
                box = (Box *)((long)((local_2a8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                    vect + lVar18 + -4);
                if (uVar25 < 4) {
                  NonLocalBC::PolarFn::operator()(&local_290,&local_338,box);
                }
                else {
                  NonLocalBC::PolarFn2::operator()(&local_290,&local_310,box);
                }
                this_01 = std::
                          map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                          ::operator[](this_00,&local_31c);
                local_258.dbox.smallend.vect._0_8_ = *(undefined8 *)(box->smallend).vect;
                uVar10 = *(undefined8 *)((box->smallend).vect + 2);
                uVar11 = *(undefined8 *)((box->bigend).vect + 2);
                local_258.dbox.bigend.vect[1] =
                     (int)((ulong)*(undefined8 *)(box->bigend).vect >> 0x20);
                local_258.dbox.bigend.vect[2] = (int)uVar11;
                local_258.dbox.btype.itype = (uint)((ulong)uVar11 >> 0x20);
                local_258.dbox.smallend.vect[2] = (int)uVar10;
                local_258.dbox.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
                local_258.sbox._20_8_ = CONCAT44(local_290.btype.itype,local_290.bigend.vect[2]);
                local_258.sbox.bigend.vect[1] = local_290.bigend.vect[1];
                local_258.sbox.smallend.vect[0] = local_290.smallend.vect[0];
                local_258.sbox.smallend.vect[1] = local_290.smallend.vect[1];
                local_258.sbox.smallend.vect[2] = local_290.smallend.vect[2];
                local_258.sbox.bigend.vect[0] = local_290.bigend.vect[0];
                iVar5._M_current =
                     (this_01->
                     super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                local_258.dstIndex = iVar15;
                local_258.srcIndex = iVar4;
                if (iVar5._M_current ==
                    (this_01->
                    super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>(this_01,iVar5,&local_258);
                }
                else {
                  *(undefined8 *)(((iVar5._M_current)->sbox).bigend.vect + 2) =
                       local_258.sbox._20_8_;
                  (iVar5._M_current)->dstIndex = iVar15;
                  (iVar5._M_current)->srcIndex = iVar4;
                  *(ulong *)(((iVar5._M_current)->sbox).smallend.vect + 1) =
                       CONCAT44(local_290.smallend.vect[2],local_258.sbox.smallend.vect[1]);
                  *(ulong *)((iVar5._M_current)->sbox).bigend.vect =
                       CONCAT44(local_290.bigend.vect[1],local_290.bigend.vect[0]);
                  *(ulong *)(((iVar5._M_current)->dbox).bigend.vect + 1) =
                       CONCAT44(local_258.dbox.bigend.vect[2],local_258.dbox.bigend.vect[1]);
                  *(ulong *)&((iVar5._M_current)->dbox).btype =
                       CONCAT44(local_258.sbox.smallend.vect[0],local_258.dbox.btype.itype);
                  *(undefined8 *)((iVar5._M_current)->dbox).smallend.vect =
                       local_258.dbox.smallend.vect._0_8_;
                  *(undefined8 *)(((iVar5._M_current)->dbox).smallend.vect + 2) = uVar10;
                  ppCVar1 = &(this_01->
                             super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              lVar18 = lVar18 + 0x20;
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != 8);
      uVar25 = local_2c0 + 1;
    } while (uVar25 != local_2c8);
    if (0 < (int)(uint)local_330) {
      local_328 = (Box *)(this->super_CommMetaData).m_RcvTags._M_t.
                         super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                         .
                         super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                         ._M_head_impl;
      local_330 = (ulong)((uint)local_330 & 0x7fffffff);
      uVar25 = 0;
      do {
        iVar4 = (local_2b8->indexArray).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar25];
        local_1f8 = uVar25;
        BATransformer::operator()
                  (&local_258.dbox,&local_318->m_bat,
                   (Box *)((long)iVar4 * 0x1c +
                          *(long *)&(((local_2b8->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        local_2c0 = CONCAT44(local_2c0._4_4_,local_258.dbox.btype.itype);
        iVar15 = (this->m_ngrow).vect[0];
        iVar20 = (this->m_ngrow).vect[1];
        uVar19 = local_258.dbox.smallend.vect[0] - iVar15;
        uVar21 = local_258.dbox.smallend.vect[1] - iVar20;
        iVar24 = (this->m_ngrow).vect[2];
        local_2c8 = CONCAT44(local_2c8._4_4_,iVar15 + local_258.dbox.bigend.vect[0]);
        local_320 = iVar20 + local_258.dbox.bigend.vect[1];
        uVar14 = local_258.dbox.smallend.vect[2] - iVar24;
        local_208 = CONCAT44(local_208._4_4_,iVar24 + local_258.dbox.bigend.vect[2]);
        uVar25 = 0;
        local_218 = CONCAT44(local_218._4_4_,uVar21);
        local_210 = CONCAT44(local_210._4_4_,uVar19);
        local_1fc = uVar14;
        do {
          local_274.smallend.vect[0] = local_1f0[uVar25 * 7];
          if ((int)local_1f0[uVar25 * 7] < (int)uVar19) {
            local_274.smallend.vect[0] = uVar19;
          }
          local_274.smallend.vect[1] = local_1f0[uVar25 * 7 + 1];
          if ((int)local_1f0[uVar25 * 7 + 1] < (int)uVar21) {
            local_274.smallend.vect[1] = uVar21;
          }
          local_274.smallend.vect[2] = local_1f0[uVar25 * 7 + 2];
          if ((int)local_1f0[uVar25 * 7 + 2] < (int)uVar14) {
            local_274.smallend.vect[2] = uVar14;
          }
          local_274.bigend.vect[0] = local_1f0[uVar25 * 7 + 3];
          if ((int)(uint)local_2c8 < (int)local_1f0[uVar25 * 7 + 3]) {
            local_274.bigend.vect[0] = (uint)local_2c8;
          }
          local_274.bigend.vect[1] = local_1f0[uVar25 * 7 + 4];
          if ((int)local_320 < (int)local_1f0[uVar25 * 7 + 4]) {
            local_274.bigend.vect[1] = local_320;
          }
          local_274.bigend.vect[2] = *(uint *)((long)&local_1dc + uVar25 * 0x1c);
          if ((int)(uint)local_208 < local_274.bigend.vect[2]) {
            local_274.bigend.vect[2] = (uint)local_208;
          }
          local_274.btype.itype = (uint)local_2c0;
          if ((local_274.smallend.vect[2] <= local_274.bigend.vect[2] && (uint)local_2c0 < 8) &&
              (local_274.smallend.vect[1] <= local_274.bigend.vect[1] &&
              local_274.smallend.vect[0] <= local_274.bigend.vect[0])) {
            if (uVar25 < 4) {
              iVar20 = local_338.Lx * 2;
              iVar15 = iVar20;
              if (local_274.bigend.vect[0] < local_338.Lx / 2) {
                iVar15 = 0;
              }
              local_308.smallend.vect[0] = iVar15 + ~local_274.bigend.vect[0];
              iVar24 = local_338.Ly / 2;
              iVar15 = -iVar24;
              if (local_274.smallend.vect[1] < iVar24) {
                iVar15 = iVar24;
              }
              local_308.smallend.vect[1] = iVar15 + local_274.smallend.vect[1];
              if (local_274.smallend.vect[0] < local_338.Lx / 2) {
                iVar20 = 0;
              }
              local_308.bigend.vect[0] = iVar20 + ~local_274.smallend.vect[0];
              iVar15 = -iVar24;
              if (local_274.bigend.vect[1] < iVar24) {
                iVar15 = iVar24;
              }
              local_308.bigend.vect[1] = iVar15 + local_274.bigend.vect[1];
              local_308.btype.itype = 0;
              local_308.bigend.vect[2] = local_274.bigend.vect[2];
              local_308.smallend.vect[2] = local_274.smallend.vect[2];
            }
            else {
              NonLocalBC::PolarFn2::operator()(&local_308,&local_310,&local_274);
            }
            BoxArray::intersections(local_318,&local_308,&local_2a8);
            uVar19 = (uint)((ulong)((long)local_2a8.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2a8.
                                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
            if (0 < (int)uVar19) {
              uVar22 = (ulong)(uVar19 & 0x7fffffff);
              lVar18 = 4;
              do {
                iVar15 = *(int *)((long)((local_2a8.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second).
                                        smallend.vect + lVar18 + -8);
                piVar2 = (int *)((long)((local_2a8.
                                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->second).
                                       smallend.vect + lVar18 + -4);
                local_2e8.smallend.vect._0_8_ = *(undefined8 *)piVar2;
                puVar3 = (undefined8 *)
                         ((long)((local_2a8.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect
                         + lVar18 + 8);
                uVar10 = *puVar3;
                local_2e8._20_8_ = puVar3[1];
                local_2e8.smallend.vect[2] = (int)*(undefined8 *)(piVar2 + 2);
                local_2e8.bigend.vect[0] = (int)uVar10;
                local_2e8.bigend.vect[1] = (int)((ulong)uVar10 >> 0x20);
                if (local_2e8.smallend.vect[2] == (this->m_domain).smallend.vect[2]) {
                  local_2e8.smallend.vect[2] = local_2e8.smallend.vect[2] - (this->m_ngrow).vect[2];
                }
                iVar20 = local_2e8.bigend.vect[2];
                if (local_2e8.bigend.vect[2] == (this->m_domain).bigend.vect[2]) {
                  iVar20 = local_2e8.bigend.vect[2] + (this->m_ngrow).vect[2];
                  local_2e8.btype.itype = (uint)((ulong)local_2e8._20_8_ >> 0x20);
                  local_2e8.bigend.vect[2] = iVar20;
                }
                if (uVar25 < 4) {
                  iVar17 = local_338.Lx * 2;
                  iVar24 = iVar17;
                  if (local_2e8.bigend.vect[0] < local_338.Lx / 2) {
                    iVar24 = 0;
                  }
                  local_290.smallend.vect[0] = iVar24 + ~local_2e8.bigend.vect[0];
                  iVar16 = local_338.Ly / 2;
                  iVar24 = -iVar16;
                  if (local_2e8.smallend.vect[1] < iVar16) {
                    iVar24 = iVar16;
                  }
                  local_290.smallend.vect[1] = iVar24 + local_2e8.smallend.vect[1];
                  if (local_2e8.smallend.vect[0] < local_338.Lx / 2) {
                    iVar17 = 0;
                  }
                  local_290.bigend.vect[0] = iVar17 + ~local_2e8.smallend.vect[0];
                  local_290.bigend.vect[1] = -iVar16;
                  if (local_2e8.bigend.vect[1] < iVar16) {
                    local_290.bigend.vect[1] = iVar16;
                  }
                  local_290.bigend.vect[1] = local_290.bigend.vect[1] + local_2e8.bigend.vect[1];
                  local_290.btype.itype = 0;
                  local_290.smallend.vect[2] = local_2e8.smallend.vect[2];
                  local_290.bigend.vect[2] = iVar20;
                }
                else {
                  NonLocalBC::PolarFn2::operator()(&local_290,&local_310,&local_2e8);
                }
                local_31c = *(int *)(*(long *)&(((local_2b8->distributionMap).m_ref.
                                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->m_pmap).
                                               super_vector<int,_std::allocator<int>_>.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    + (long)iVar15 * 4);
                local_258.dbox.bigend.vect[1] = local_290.bigend.vect[1];
                local_258.dbox.bigend.vect[2] = local_290.bigend.vect[2];
                local_258.dbox.btype.itype = local_290.btype.itype;
                local_258.dbox.smallend.vect[0] = local_290.smallend.vect[0];
                local_258.dbox.smallend.vect[1] = local_290.smallend.vect[1];
                local_258.dbox.smallend.vect[2] = local_290.smallend.vect[2];
                local_258.dbox.bigend.vect[0] = local_290.bigend.vect[0];
                local_258.sbox.bigend.vect[1] = local_2e8.bigend.vect[1];
                local_258.sbox.bigend.vect[2] = local_2e8.bigend.vect[2];
                local_258.sbox.btype.itype = local_2e8.btype.itype;
                local_258.sbox.smallend.vect[0] = local_2e8.smallend.vect[0];
                local_258.sbox.smallend.vect[1] = local_2e8.smallend.vect[1];
                local_258.sbox.smallend.vect[2] = local_2e8.smallend.vect[2];
                local_258.sbox.bigend.vect[0] = local_2e8.bigend.vect[0];
                local_258.dstIndex = iVar4;
                local_258.srcIndex = iVar15;
                if (local_31c == local_2ac) {
                  this_02 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                             *)(this->super_CommMetaData).m_LocTags._M_t.
                               super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                               ._M_head_impl;
                }
                else {
                  this_02 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                             *)std::
                               map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                               ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                             *)local_328,&local_31c);
                }
                iVar5._M_current = *(CopyComTag **)(this_02 + 8);
                if (iVar5._M_current == *(CopyComTag **)(this_02 + 0x10)) {
                  std::
                  vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                  ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag_const&>
                            (this_02,iVar5,&local_258);
                }
                else {
                  *(undefined8 *)(((iVar5._M_current)->sbox).bigend.vect + 2) =
                       local_258.sbox._20_8_;
                  (iVar5._M_current)->dstIndex = local_258.dstIndex;
                  (iVar5._M_current)->srcIndex = local_258.srcIndex;
                  *(ulong *)(((iVar5._M_current)->sbox).smallend.vect + 1) =
                       CONCAT44(local_258.sbox.smallend.vect[2],local_258.sbox.smallend.vect[1]);
                  *(ulong *)((iVar5._M_current)->sbox).bigend.vect =
                       CONCAT44(local_258.sbox.bigend.vect[1],local_258.sbox.bigend.vect[0]);
                  *(ulong *)(((iVar5._M_current)->dbox).bigend.vect + 1) =
                       CONCAT44(local_258.dbox.bigend.vect[2],local_258.dbox.bigend.vect[1]);
                  *(ulong *)&((iVar5._M_current)->dbox).btype =
                       CONCAT44(local_258.sbox.smallend.vect[0],local_258.dbox.btype.itype);
                  *(undefined8 *)((iVar5._M_current)->dbox).smallend.vect =
                       local_258.dbox.smallend.vect._0_8_;
                  *(ulong *)(((iVar5._M_current)->dbox).smallend.vect + 2) =
                       CONCAT44(local_258.dbox.bigend.vect[0],local_258.dbox.smallend.vect[2]);
                  *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x40;
                }
                lVar18 = lVar18 + 0x20;
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            uVar19 = (uint)local_210;
            uVar21 = (uint)local_218;
            uVar14 = local_1fc;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != 8);
        uVar25 = local_1f8 + 1;
      } while (uVar25 != local_330);
    }
  }
  bVar12 = true;
  do {
    bVar9 = bVar12;
    lVar18 = *(long *)((this->m_ngrow).vect + (ulong)((byte)~bVar9 & 1) * 2 + -4);
    for (p_Var13 = *(_Rb_tree_node_base **)(lVar18 + 0x18);
        p_Var13 != (_Rb_tree_node_base *)(lVar18 + 8);
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      p_Var6 = p_Var13[1]._M_parent;
      p_Var7 = p_Var13[1]._M_left;
      if (p_Var6 != p_Var7) {
        uVar25 = (long)p_Var7 - (long)p_Var6 >> 6;
        lVar8 = 0x3f;
        if (uVar25 != 0) {
          for (; uVar25 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var6,p_Var7,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var6,p_Var7);
      }
    }
    bVar12 = false;
  } while (bVar9);
  if (local_2a8.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
FabArrayBase::PolarB::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    const int ymid = m_domain.length(1) / 2;
    Box lox_box = amrex::adjCellLo(m_domain, 0, m_ngrow[0]);
    Box hix_box = amrex::adjCellHi(m_domain, 0, m_ngrow[0]);
#if (AMREX_SPACEDIM == 3)
    lox_box.grow(2, m_ngrow[2]);
    hix_box.grow(2, m_ngrow[2]);
#endif
    Box loxy_corner(IntVect{AMREX_D_DECL(-m_ngrow[0],-m_ngrow[1],-m_ngrow[2])},
                    IntVect{AMREX_D_DECL(-1,-1,m_domain.bigEnd(2)+m_ngrow[2])});
    Array<Box,8> const domain_dst{Box(lox_box).setBig  (1,ymid-1),
                                  Box(lox_box).setSmall(1,ymid  ),
                                  Box(hix_box).setBig  (1,ymid-1),
                                  Box(hix_box).setSmall(1,ymid  ),
                                  loxy_corner,
                                  amrex::shift(loxy_corner,1,m_domain.length(1)+m_ngrow[1]),
                                  amrex::shift(loxy_corner,0,m_domain.length(0)+m_ngrow[0]),
                                  amrex::shift(loxy_corner,
                                               IntVect{AMREX_D_DECL(m_domain.length(0)+m_ngrow[0],
                                                                    m_domain.length(1)+m_ngrow[1],
                                                                    0)})};

    auto const convert = NonLocalBC::PolarFn{m_domain.length(0), m_domain.length(1)};
    auto const convert_corner = NonLocalBC::PolarFn2{m_domain.length(0), m_domain.length(1)};

    Array<Box,8> const domain_src{convert(domain_dst[0]), convert(domain_dst[1]),
                                  convert(domain_dst[2]), convert(domain_dst[3]),
                                  convert_corner(domain_dst[4]), convert_corner(domain_dst[5]),
                                  convert_corner(domain_dst[6]), convert_corner(domain_dst[7])};

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
#if (AMREX_SPACEDIM == 3)
        if (gbx.smallEnd(2) == m_domain.smallEnd(2)) {
            gbx.growLo(2, m_ngrow[2]);
        }
        if (gbx.bigEnd(2) == m_domain.bigEnd(2)) {
            gbx.growHi(2, m_ngrow[2]);
        }
#endif

        for (int n = 0; n < 8; ++n) {
            Box const src_box = gbx & domain_src[n];
            if (src_box.ok()) {
                Box const dst_box = (n<4) ? convert(src_box) : convert_corner(src_box);
                ba.intersections(dst_box, isects, false, m_ngrow);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int krcv = isects[j].first;
                    const Box& bxrcv = isects[j].second;
                    const int dst_owner = dm[krcv];
                    if (dst_owner != myproc) // local copy will be dealt with later
                    {
                        Box const bxsnd = (n<4) ? convert(bxrcv) : convert_corner(bxrcv);
                        send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                                krcv, ksnd));
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        for (int n = 0; n < 8; ++n) {
            Box const dst_box = gbx & domain_dst[n];
            if (dst_box.ok()) {
                Box const src_box = (n<4) ? convert(dst_box) : convert_corner(dst_box);
                ba.intersections(src_box, isects);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int ksnd = isects[j].first;
                    Box bxsnd = isects[j].second;
                    // the ghosts at lo-x and hi-z boundary are the source too
#if (AMREX_SPACEDIM == 3)
                    if (bxsnd.smallEnd(2) == m_domain.smallEnd(2)) {
                        bxsnd.growLo(2, m_ngrow[2]);
                    }
                    if (bxsnd.bigEnd(2) == m_domain.bigEnd(2)) {
                        bxsnd.growHi(2, m_ngrow[2]);
                    }
#endif
                    const Box bxrcv = (n<4) ? convert(bxsnd) : convert_corner(bxsnd);
                    const int src_owner = dm[ksnd];
                    FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                    if (src_owner == myproc) {
                        m_LocTags->push_back(cct);
                    } else {
                        recv_tags[src_owner].push_back(cct);
                    }
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}